

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_stbvorbis_init_internal_decoder_push(ma_stbvorbis *pVorbis)

{
  ma_result mVar1;
  void *__dest;
  stb_vorbis *psVar2;
  long in_RDI;
  ma_uint8 *pNewData;
  size_t bytesRead;
  int consumedDataSize;
  int vorbisError;
  ma_uint8 *pData;
  size_t dataCapacity;
  size_t dataSize;
  stb_vorbis *stb;
  ma_result result;
  stb_vorbis_alloc *in_stack_00000718;
  int *in_stack_00000720;
  int *in_stack_00000728;
  int in_stack_00000734;
  uchar *in_stack_00000738;
  ma_allocation_callbacks *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  int local_40;
  int local_3c;
  long local_30;
  ulong local_28;
  
  local_28 = 0;
  local_30 = 0;
  while( true ) {
    local_30 = local_30 + 0x1000;
    __dest = ma_realloc(in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    if (__dest == (void *)0x0) {
      ma_free((void *)0x0,in_stack_ffffffffffffffa8);
      return MA_OUT_OF_MEMORY;
    }
    in_stack_ffffffffffffffb0 = __dest;
    mVar1 = (**(code **)(in_RDI + 0x48))
                      (*(undefined8 *)(in_RDI + 0x60),(long)__dest + local_28,local_30 - local_28,
                       &stack0xffffffffffffffb8);
    local_28 = (long)in_stack_ffffffffffffffb8 + local_28;
    if (mVar1 != MA_SUCCESS) {
      ma_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      return mVar1;
    }
    if (0x7fffffff < local_28) {
      ma_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      return MA_TOO_BIG;
    }
    psVar2 = stb_vorbis_open_pushdata
                       (in_stack_00000738,in_stack_00000734,in_stack_00000728,in_stack_00000720,
                        in_stack_00000718);
    if (psVar2 != (stb_vorbis *)0x0) break;
    if (local_3c != 1) {
      ma_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      return MA_ERROR;
    }
  }
  memmove(__dest,(void *)((long)__dest + (long)local_40),local_28 - (long)local_40);
  *(long *)(in_RDI + 200) = (long)local_40;
  *(stb_vorbis **)(in_RDI + 0xa0) = psVar2;
  *(void **)(in_RDI + 0xb0) = __dest;
  *(ulong *)(in_RDI + 0xb8) = local_28 - (long)local_40;
  *(long *)(in_RDI + 0xc0) = local_30;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_stbvorbis_init_internal_decoder_push(ma_stbvorbis* pVorbis)
{
    ma_result result;
    stb_vorbis* stb;
    size_t dataSize = 0;
    size_t dataCapacity = 0;
    ma_uint8* pData = NULL; /* <-- Must be initialized to NULL. */

    for (;;) {
        int vorbisError;
        int consumedDataSize;   /* <-- Fill by stb_vorbis_open_pushdata(). */
        size_t bytesRead;
        ma_uint8* pNewData;

        /* Allocate memory for the new chunk. */
        dataCapacity += MA_VORBIS_DATA_CHUNK_SIZE;
        pNewData = (ma_uint8*)ma_realloc(pData, dataCapacity, &pVorbis->allocationCallbacks);
        if (pNewData == NULL) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return MA_OUT_OF_MEMORY;
        }

        pData = pNewData;

        /* Read in the next chunk. */
        result = pVorbis->onRead(pVorbis->pReadSeekTellUserData, ma_offset_ptr(pData, dataSize), (dataCapacity - dataSize), &bytesRead);
        dataSize += bytesRead;

        if (result != MA_SUCCESS) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return result;
        }

        /* We have a maximum of 31 bits with stb_vorbis. */
        if (dataSize > INT_MAX) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return MA_TOO_BIG;
        }

        stb = stb_vorbis_open_pushdata(pData, (int)dataSize, &consumedDataSize, &vorbisError, NULL);
        if (stb != NULL) {
            /*
            Successfully opened the Vorbis decoder. We might have some leftover unprocessed
            data so we'll need to move that down to the front.
            */
            dataSize -= (size_t)consumedDataSize;   /* Consume the data. */
            MA_MOVE_MEMORY(pData, ma_offset_ptr(pData, consumedDataSize), dataSize);

            /*
            We need to track the start point so we can seek back to the start of the audio
            data when seeking.
            */
            pVorbis->push.audioStartOffsetInBytes = consumedDataSize;

            break;
        } else {
            /* Failed to open the decoder. */
            if (vorbisError == VORBIS_need_more_data) {
                continue;
            } else {
                ma_free(pData, &pVorbis->allocationCallbacks);
                return MA_ERROR;   /* Failed to open the stb_vorbis decoder. */
            }
        }
    }

    MA_ASSERT(stb != NULL);
    pVorbis->stb = stb;
    pVorbis->push.pData = pData;
    pVorbis->push.dataSize = dataSize;
    pVorbis->push.dataCapacity = dataCapacity;

    return MA_SUCCESS;
}